

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFileParser::ParseFile(cmListFileParser *this,char *filename)

{
  bool bVar1;
  int iVar2;
  cmListFileLexer_BOM bom;
  string local_38;
  cmListFileLexer_BOM local_14;
  
  this->FileName = filename;
  iVar2 = cmListFileLexer_SetFileName(this->Lexer,filename,&local_14);
  if (iVar2 == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"cmListFileCache: error can not open file.","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,&local_38,&this->Backtrace);
  }
  else if (local_14 == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Error while reading Byte-Order-Mark. File not seekable?","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,&local_38,&this->Backtrace);
  }
  else {
    if ((local_14 & ~cmListFileLexer_BOM_UTF8) == cmListFileLexer_BOM_None) {
      bVar1 = Parse(this);
      return bVar1;
    }
    cmListFileLexer_SetFileName(this->Lexer,(char *)0x0,(cmListFileLexer_BOM *)0x0);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"File starts with a Byte-Order-Mark that is not UTF-8.","");
    cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,&local_38,&this->Backtrace);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmListFileParser::ParseFile(const char* filename)
{
  this->FileName = filename;

#ifdef _WIN32
  std::string expandedFileName = cmsys::Encoding::ToNarrow(
    cmSystemTools::ConvertToWindowsExtendedPath(filename));
  filename = expandedFileName.c_str();
#endif

  // Open the file.
  cmListFileLexer_BOM bom;
  if (!cmListFileLexer_SetFileName(this->Lexer, filename, &bom)) {
    this->IssueFileOpenError("cmListFileCache: error can not open file.");
    return false;
  }

  if (bom == cmListFileLexer_BOM_Broken) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError("Error while reading Byte-Order-Mark. "
                             "File not seekable?");
    return false;
  }

  // Verify the Byte-Order-Mark, if any.
  if (bom != cmListFileLexer_BOM_None && bom != cmListFileLexer_BOM_UTF8) {
    cmListFileLexer_SetFileName(this->Lexer, nullptr, nullptr);
    this->IssueFileOpenError(
      "File starts with a Byte-Order-Mark that is not UTF-8.");
    return false;
  }

  return this->Parse();
}